

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O0

void on_read1(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  if (nread < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x41,"nread",">=","0",nread,">=",0);
    abort();
  }
  do_write(stream,on_write);
  iVar1 = uv_read_stop(stream);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x48,"uv_read_stop(stream)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_read_start(stream,on_alloc,on_read2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x4a,"uv_read_start(stream, on_alloc, on_read2)","==","0",(long)iVar1,"==",0);
    abort();
  }
  read_cb_called = read_cb_called + 1;
  return;
}

Assistant:

static void on_read1(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  ASSERT_GE(nread, 0);

  /* Do write on a half open connection to force WSAECONNABORTED (on Windows)
   * in the subsequent uv_read_start()
   */
  do_write(stream, on_write);

  ASSERT_OK(uv_read_stop(stream));

  ASSERT_OK(uv_read_start(stream, on_alloc, on_read2));

  read_cb_called++;
}